

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O2

int main(void)

{
  byte bVar1;
  ostream *poVar2;
  int iVar3;
  pointer piVar4;
  int n;
  vector<int,_std::allocator<int>_> series;
  
  std::operator<<((ostream *)&std::cout,"How many Fibonacci numbers needs to be found:\n");
  n = 0;
  std::istream::operator>>((istream *)&std::cin,&n);
  calculateFibonacci(&series,n);
  bVar1 = 0;
  iVar3 = 0;
  for (piVar4 = series.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start;
      piVar4 < series.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish; piVar4 = piVar4 + 1) {
    if (!(bool)(-1 < *piVar4 | bVar1)) {
      iVar3 = piVar4[-1];
      bVar1 = 1;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
    std::operator<<(poVar2,' ');
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\nMax Fibonacci number that fits into 32 bit integer is: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  std::operator<<(poVar2,'\n');
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&series.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
	std::cout << "How many Fibonacci numbers needs to be found:\n";
	auto n = 0;
	std::cin >> n;
	auto series = calculateFibonacci(n);
	bool isNegativeNumFound = false;
	auto maxFibonacciThatFitsInInt = 0;
	for (auto it = series.begin(); it < series.end(); ++it)
	{
		if (*it < 0 && not isNegativeNumFound)
		{
			isNegativeNumFound = true;
			maxFibonacciThatFitsInInt = *(it - 1);
		}
		std::cout << *it << ' ';
	}
	std::cout << "\nMax Fibonacci number that fits into 32 bit integer is: "
			  << maxFibonacciThatFitsInInt << '\n';
	return 0;
}